

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

Dtt_Man_t * Dtt_ManAlloc(int nVars,int fMulti)

{
  int iVar1;
  uint uVar2;
  Dtt_Man_t *pDVar3;
  int *piVar4;
  word *pwVar5;
  Vec_Int_t *pVVar6;
  Vec_Wec_t *pVVar7;
  uint *puVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  size_t __nmemb;
  
  pDVar3 = (Dtt_Man_t *)calloc(1,0x138);
  pDVar3->nVars = nVars;
  iVar1 = Extra_Factorial(nVars);
  pDVar3->nPerms = iVar1;
  iVar1 = 1 << ((byte)nVars & 0x1f);
  pDVar3->nComps = iVar1;
  piVar4 = Extra_PermSchedule(nVars);
  pDVar3->pPerms = piVar4;
  piVar4 = Extra_GreyCodeSchedule(nVars);
  pDVar3->pComps = piVar4;
  pwVar5 = (word *)calloc((long)(1 << ((char)iVar1 - 7U & 0x1f)),8);
  pDVar3->pPres = pwVar5;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x12d450;
  pVVar6->nSize = 0;
  piVar4 = (int *)malloc(0x4b5140);
  pVVar6->pArray = piVar4;
  pDVar3->vFanins = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x96a28;
  pVVar6->nSize = 0;
  piVar4 = (int *)malloc(0x25a8a0);
  pVVar6->pArray = piVar4;
  pDVar3->vTruths = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x96a28;
  pVVar6->nSize = 0;
  piVar4 = (int *)malloc(0x25a8a0);
  pVVar6->pArray = piVar4;
  pDVar3->vConfigs = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x96a28;
  pVVar6->nSize = 0;
  piVar4 = (int *)malloc(0x25a8a0);
  pVVar6->pArray = piVar4;
  pDVar3->vClasses = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x96a28;
  pVVar6->nSize = 0;
  piVar4 = (int *)malloc(0x25a8a0);
  pVVar6->pArray = piVar4;
  pDVar3->vTruthNpns = pVVar6;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  pVVar7->nCap = 0x10;
  pVVar7->nSize = 0;
  pVVar6 = (Vec_Int_t *)calloc(0x10,0x10);
  pVVar7->pArray = pVVar6;
  pVVar7->nSize = 0x10;
  pDVar3->vFunNodes = pVVar7;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 4000;
  pVVar6->nSize = 0;
  piVar4 = (int *)malloc(16000);
  pVVar6->pArray = piVar4;
  pDVar3->vTemp = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 4000;
  pVVar6->nSize = 0;
  piVar4 = (int *)malloc(16000);
  pVVar6->pArray = piVar4;
  pDVar3->vTemp2 = pVVar6;
  uVar2 = 0xffff;
  if (nVars != 4) {
    uVar2 = 0xff;
  }
  uVar11 = 0x80;
  if (nVars == 4) {
    uVar11 = 0x8000;
  }
  uVar10 = 0xffffffff;
  if (nVars != 5) {
    uVar10 = uVar2;
  }
  pDVar3->FunMask = uVar10;
  uVar2 = 0x80000000;
  if (nVars != 5) {
    uVar2 = uVar11;
  }
  pDVar3->CmpMask = uVar2;
  pDVar3->BinMask = 0x3fff;
  puVar8 = (uint *)malloc(0x10000);
  memset(puVar8,0xff,0x10000);
  pDVar3->pBins = puVar8;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 4000;
  pVVar6->nSize = 0;
  piVar4 = (int *)malloc(16000);
  pVVar6->pArray = piVar4;
  pDVar3->vUsedBins = pVVar6;
  if (fMulti != 0) {
    puVar8 = Dtt_ManLoadClasses(nVars,&pDVar3->nClasses);
    pDVar3->pTable = puVar8;
    __nmemb = (size_t)pDVar3->nClasses;
    piVar4 = (int *)calloc(__nmemb,4);
    pDVar3->pNodes = piVar4;
    piVar4 = (int *)calloc(__nmemb,4);
    pDVar3->pTimes = piVar4;
    pcVar9 = (char *)calloc(__nmemb,1);
    pDVar3->pVisited = pcVar9;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 1000;
    pVVar6->nSize = 0;
    piVar4 = (int *)malloc(4000);
    pVVar6->pArray = piVar4;
    pDVar3->vVisited = pVVar6;
  }
  return pDVar3;
}

Assistant:

Dtt_Man_t * Dtt_ManAlloc( int nVars, int fMulti )
{
    Dtt_Man_t * p = ABC_CALLOC( Dtt_Man_t, 1 );
    p->nVars      = nVars;
    p->nPerms     = Extra_Factorial( nVars );
    p->nComps     = 1 << nVars;
    p->pPerms     = Extra_PermSchedule( nVars );
    p->pComps     = Extra_GreyCodeSchedule( nVars );
    p->pPres      = ABC_CALLOC( word, 1 << (p->nComps - 7) );
    p->vFanins    = Vec_IntAlloc( 2*617000 );
    p->vTruths    = Vec_IntAlloc( 617000 );
    p->vConfigs   = Vec_IntAlloc( 617000 );
    p->vClasses   = Vec_IntAlloc( 617000 );
    p->vTruthNpns = Vec_IntAlloc( 617000 );
    p->vFunNodes  = Vec_WecStart( 16 );
    p->vTemp      = Vec_IntAlloc( 4000 );
    p->vTemp2     = Vec_IntAlloc( 4000 );
    p->FunMask    = nVars == 5 ?      ~0 : (nVars == 4 ?  0xFFFF :   0xFF);
    p->CmpMask    = nVars == 5 ? 1 << 31 : (nVars == 4 ? 1 << 15 : 1 << 7);
    p->BinMask    = 0x3FFF;
    p->pBins      = ABC_FALLOC( unsigned, p->BinMask + 1 );
    p->vUsedBins  = Vec_IntAlloc( 4000 );
    if ( !fMulti ) return p;
    p->pTable     = Dtt_ManLoadClasses( p->nVars, &p->nClasses );
    p->pNodes     = ABC_CALLOC( int, p->nClasses );
    p->pTimes     = ABC_CALLOC( int, p->nClasses );
    p->pVisited   = ABC_CALLOC( char, p->nClasses );
    p->vVisited   = Vec_IntAlloc( 1000 );
    return p;
}